

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O3

void peer_change_user_data(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  WaitResult<bool> WVar2;
  FindUserDataCallable find_peer2;
  Peer peer2;
  Peer peer1;
  undefined1 local_120 [8];
  char *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_f8;
  Peer local_d8;
  PeerParameters local_c0;
  Peer local_90;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_c0.min_supported_protocol_version_ = kProtocolVersion1;
  local_c0.max_supported_protocol_version_ = kProtocolVersion1;
  local_c0.can_use_broadcast_ = true;
  local_c0.can_use_multicast_ = false;
  local_c0.discovered_peer_ttl_ms_ = 10000;
  local_c0.discover_self_ = false;
  local_c0.same_peer_mode_ = kSamePeerIpAndPort;
  local_c0.can_be_discovered_ = true;
  local_c0.can_discover_ = true;
  local_c0.port_ = 0x2ef5;
  local_c0.multicast_group_address_ = 0xe000007b;
  local_c0.application_id_ = 0x753584;
  local_c0.send_timeout_ms_ = 100;
  udpdiscovery::Peer::Peer(&local_90);
  local_120 = (undefined1  [8])&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"peer 1","");
  udpdiscovery::Peer::Start(&local_90,&local_c0,(string *)local_120);
  if (local_120 != (undefined1  [8])&local_110) {
    operator_delete((void *)local_120);
  }
  udpdiscovery::impl::SleepFor(1000);
  udpdiscovery::Peer::Peer(&local_d8);
  local_120 = (undefined1  [8])&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"peer 2","");
  udpdiscovery::Peer::Start(&local_d8,&local_c0,(string *)local_120);
  if (local_120 != (undefined1  [8])&local_110) {
    operator_delete((void *)local_120);
  }
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"peer 2","");
  local_120 = (undefined1  [8])&local_90;
  local_118 = local_110._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_f8._M_dataplus._M_p,
             local_f8._M_dataplus._M_p + local_f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_50 = local_120;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_118,local_118 + local_110._M_allocated_capacity);
  WVar2 = Wait<bool,FindUserDataCallable>(5000,200,(FindUserDataCallable *)local_50);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if (((uint3)WVar2 & 1) != 0) {
    __assert_fail("find.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xc4,"void peer_change_user_data()");
  }
  if (((uint3)WVar2 >> 8 & 1) == 0) {
    __assert_fail("find.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xc5,"void peer_change_user_data()");
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"peer 2 updated user data","")
  ;
  udpdiscovery::Peer::SetUserData(&local_d8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"peer 2 updated user data","")
  ;
  std::__cxx11::string::_M_assign((string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_78 = local_120;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_118,local_118 + local_110._M_allocated_capacity);
  WVar2 = Wait<bool,FindUserDataCallable>(5000,200,(FindUserDataCallable *)local_78);
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if (((uint3)WVar2 & 1) == 0) {
    if (((uint3)WVar2 >> 8 & 1) != 0) {
      udpdiscovery::Peer::StopAndWaitForThreads(&local_90);
      udpdiscovery::Peer::StopAndWaitForThreads(&local_d8);
      if (local_118 != local_110._M_local_buf + 8) {
        operator_delete(local_118);
      }
      udpdiscovery::Peer::~Peer(&local_d8);
      udpdiscovery::Peer::~Peer(&local_90);
      return;
    }
    __assert_fail("find.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xcd,"void peer_change_user_data()");
  }
  __assert_fail("find.is_timeout == false",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                ,0xcc,"void peer_change_user_data()");
}

Assistant:

void peer_change_user_data() {
  udpdiscovery::PeerParameters peer_parameters;
  peer_parameters.set_can_discover(true);
  peer_parameters.set_can_be_discovered(true);
  peer_parameters.set_port(kPort);
  peer_parameters.set_application_id(kApplicationId);
  peer_parameters.set_send_timeout_ms(100);
  peer_parameters.set_multicast_group_address(kMulticastAddress);

  udpdiscovery::Peer peer1;
  peer1.Start(peer_parameters, "peer 1");

  // TODO: Understand why do we need this timeout.
  udpdiscovery::impl::SleepFor(1000);

  udpdiscovery::Peer peer2;
  peer2.Start(peer_parameters, "peer 2");

  FindUserDataCallable find_peer2(peer1, "peer 2");
  WaitResult<bool> find =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer2);
  assert(find.is_timeout == false);
  assert(find.has_result == true);

  peer2.SetUserData("peer 2 updated user data");

  find_peer2.SetUserData("peer 2 updated user data");
  find = Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                    /* callable= */ find_peer2);
  assert(find.is_timeout == false);
  assert(find.has_result == true);

  peer1.StopAndWaitForThreads();
  peer2.StopAndWaitForThreads();
}